

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1521.cpp
# Opt level: O0

int find_kth(int x,int kth)

{
  int local_10;
  int local_c;
  int kth_local;
  int x_local;
  
  local_10 = kth;
  local_c = x;
  while (local_c < maxn) {
    local_c = local_c * 2;
    if (t[local_c] < local_10) {
      local_10 = local_10 - t[local_c];
      local_c = local_c + 1;
    }
  }
  return local_c - maxn;
}

Assistant:

int find_kth(int x, int kth) {
    while (x < maxn){
        x *= 2;
        if (kth > t[x]) {
            kth -= t[x];
            x++;
        }
    }
    return x - maxn;
}